

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

void __thiscall
QPDFFormFieldObjectHelper::generateAppearance
          (QPDFFormFieldObjectHelper *this,QPDFAnnotationObjectHelper *aoh)

{
  int iVar1;
  string ft;
  string local_38;
  
  getFieldType_abi_cxx11_(&local_38,this);
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 != 0) goto LAB_0016c028;
  }
  generateTextAppearance(this,aoh);
LAB_0016c028:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::generateAppearance(QPDFAnnotationObjectHelper& aoh)
{
    std::string ft = getFieldType();
    // Ignore field types we don't know how to generate appearances for. Button fields don't really
    // need them -- see code in QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded.
    if ((ft == "/Tx") || (ft == "/Ch")) {
        generateTextAppearance(aoh);
    }
}